

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UnicodeString *left,UnicodeString *right,UErrorCode *errorCode)

{
  ushort uVar1;
  int32_t leftLength;
  UCollationResult UVar2;
  char16_t *right_00;
  char16_t *left_00;
  int32_t rightLength;
  
  if (U_ZERO_ERROR < *errorCode) {
    return UCOL_EQUAL;
  }
  uVar1 = (left->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      left_00 = (left->fUnion).fFields.fArray;
    }
    else {
      left_00 = (left->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    left_00 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    leftLength = (left->fUnion).fFields.fLength;
  }
  else {
    leftLength = (int)(short)uVar1 >> 5;
  }
  uVar1 = (right->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      right_00 = (right->fUnion).fFields.fArray;
    }
    else {
      right_00 = (right->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    right_00 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    rightLength = (right->fUnion).fFields.fLength;
  }
  else {
    rightLength = (int)(short)uVar1 >> 5;
  }
  UVar2 = doCompare(this,left_00,leftLength,right_00,rightLength,errorCode);
  return UVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }